

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIComboBox.cpp
# Opt level: O3

void __thiscall irr::gui::CGUIComboBox::draw(CGUIComboBox *this)

{
  IGUIFont *pIVar1;
  IGUIStaticText *pIVar2;
  IGUIButton *pIVar3;
  char cVar4;
  byte bVar5;
  s32 width;
  uint uVar6;
  uint uVar7;
  undefined4 uVar8;
  long *plVar9;
  IGUIFont *pIVar10;
  CGUIComboBox *pCVar11;
  CGUIComboBox *pCVar12;
  CGUIComboBox *pCVar13;
  int iVar14;
  undefined8 *puVar15;
  bool bVar16;
  rect<int> frameRect;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  if (this->field_0xa0 == '\x01') {
    plVar9 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
    width = (**(code **)(*plVar9 + 0x10))(plVar9,0);
    updateListButtonWidth(this,width);
    pIVar1 = this->ActiveFont;
    pIVar10 = (IGUIFont *)(**(code **)(*plVar9 + 0x30))(plVar9,0);
    if ((pIVar1 != pIVar10) && (this->ListBox != (IGUIListBox *)0x0)) {
      openCloseMenu(this);
      openCloseMenu(this);
    }
    pCVar11 = (CGUIComboBox *)(**(code **)(**(long **)&this->field_0x128 + 0x10))();
    if (pCVar11 != (CGUIComboBox *)this->LastFocus) {
      if (pCVar11 == this) {
        bVar16 = true;
      }
      else if (pCVar11 == (CGUIComboBox *)0x0) {
        bVar16 = false;
      }
      else {
        pCVar13 = *(CGUIComboBox **)&pCVar11->field_0x20;
        pCVar12 = pCVar11;
        do {
          if (pCVar13 != (CGUIComboBox *)0x0) {
            pCVar12 = pCVar13;
          }
          pCVar13 = *(CGUIComboBox **)&pCVar12->field_0x20;
        } while ((pCVar13 != (CGUIComboBox *)0x0) && (pCVar12 != this));
        bVar16 = pCVar12 == this;
      }
      this->HasFocus = bVar16;
      this->LastFocus = (IGUIElement *)pCVar11;
    }
    pIVar2 = this->SelectedText;
    uVar6 = (**(code **)*plVar9)(plVar9,10);
    (*(pIVar2->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x2c])
              (pIVar2,(ulong)uVar6);
    cVar4 = (**(code **)(*(long *)this + 0x90))(this);
    pIVar2 = this->SelectedText;
    if (cVar4 == '\0') {
      (*(pIVar2->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x2d])(pIVar2,0);
      iVar14 = 9;
    }
    else {
      (*(pIVar2->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x2d])
                (pIVar2,(ulong)this->HasFocus);
      iVar14 = (uint)this->HasFocus + (uint)this->HasFocus * 2 + 8;
    }
    pIVar2 = this->SelectedText;
    uVar6 = (**(code **)*plVar9)(plVar9,iVar14);
    (*(pIVar2->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x27])
              (pIVar2,(ulong)uVar6);
    pIVar3 = this->ListButton;
    uVar6 = (**(code **)(*plVar9 + 0x50))(plVar9,6);
    bVar5 = (**(code **)(*(long *)this + 0x90))(this);
    uVar7 = (**(code **)*plVar9)(plVar9,(uint)(bVar5 ^ 1) + (uint)(bVar5 ^ 1) * 2 + 0x12);
    (*(pIVar3->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x32])
              (pIVar3,0,(ulong)uVar6,(ulong)uVar7,0,0);
    pIVar3 = this->ListButton;
    uVar6 = (**(code **)(*plVar9 + 0x50))(plVar9,6);
    bVar5 = (**(code **)(*(long *)this + 0x90))(this);
    uVar7 = (**(code **)*plVar9)(plVar9,(uint)(bVar5 ^ 1) + (uint)(bVar5 ^ 1) * 2 + 0x12);
    (*(pIVar3->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x32])
              (pIVar3,1,(ulong)uVar6,(ulong)uVar7,0,0);
    local_38 = *(undefined4 *)&this->field_0x40;
    uStack_34 = *(undefined4 *)&this->field_0x44;
    uStack_30 = *(undefined4 *)&this->field_0x48;
    uStack_2c = *(undefined4 *)&this->field_0x4c;
    uVar8 = (**(code **)*plVar9)(plVar9,3);
    (**(code **)(*plVar9 + 0x70))(plVar9,this,uVar8,1,1,&local_38,&this->field_0x50);
    cVar4 = (**(code **)(*(long *)this + 0x68))(this);
    if (cVar4 != '\0') {
      for (puVar15 = *(undefined8 **)&this->field_0x8; puVar15 != (undefined8 *)&this->field_0x8;
          puVar15 = (undefined8 *)*puVar15) {
        (**(code **)(*(long *)puVar15[2] + 0x50))();
      }
    }
  }
  return;
}

Assistant:

void CGUIComboBox::draw()
{
	if (!IsVisible)
		return;

	IGUISkin *skin = Environment->getSkin();

	updateListButtonWidth(skin->getSize(EGDS_SCROLLBAR_SIZE));

	// font changed while the listbox is open?
	if (ActiveFont != skin->getFont() && ListBox) {
		// close and re-open to use new font-size
		openCloseMenu();
		openCloseMenu();
	}

	IGUIElement *currentFocus = Environment->getFocus();
	if (currentFocus != LastFocus) {
		HasFocus = currentFocus == this || isMyChild(currentFocus);
		LastFocus = currentFocus;
	}

	// set colors each time as skin-colors can be changed
	SelectedText->setBackgroundColor(skin->getColor(EGDC_HIGH_LIGHT));
	if (isEnabled()) {
		SelectedText->setDrawBackground(HasFocus);
		SelectedText->setOverrideColor(skin->getColor(HasFocus ? EGDC_HIGH_LIGHT_TEXT : EGDC_BUTTON_TEXT));
	} else {
		SelectedText->setDrawBackground(false);
		SelectedText->setOverrideColor(skin->getColor(EGDC_GRAY_TEXT));
	}
	ListButton->setSprite(EGBS_BUTTON_UP, skin->getIcon(EGDI_CURSOR_DOWN), skin->getColor(isEnabled() ? EGDC_WINDOW_SYMBOL : EGDC_GRAY_WINDOW_SYMBOL));
	ListButton->setSprite(EGBS_BUTTON_DOWN, skin->getIcon(EGDI_CURSOR_DOWN), skin->getColor(isEnabled() ? EGDC_WINDOW_SYMBOL : EGDC_GRAY_WINDOW_SYMBOL));

	core::rect<s32> frameRect(AbsoluteRect);

	// draw the border

	skin->draw3DSunkenPane(this, skin->getColor(EGDC_3D_HIGH_LIGHT),
			true, true, frameRect, &AbsoluteClippingRect);

	// draw children
	IGUIElement::draw();
}